

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O2

void initAvailableConvertersList(UErrorCode *errCode)

{
  UBool UVar1;
  int32_t iVar2;
  UEnumeration *en;
  UConverter *converter;
  char *converterName;
  ulong uVar3;
  bool bVar4;
  UErrorCode localStatus;
  UConverter tempConverter;
  UErrorCode local_144;
  UConverter local_140;
  
  ucnv_enableCleanup_63();
  en = ucnv_openAllNames_63(errCode);
  iVar2 = uenum_count_63(en,errCode);
  if (*errCode < U_ILLEGAL_ARGUMENT_ERROR) {
    gAvailableConverters = (char **)uprv_malloc_63((long)iVar2 << 3);
    if (gAvailableConverters == (char **)0x0) {
      *errCode = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      local_144 = U_ZERO_ERROR;
      converter = ucnv_createConverter_63(&local_140,(char *)0x0,&local_144);
      ucnv_close_63(converter);
      gAvailableConverterCount = 0;
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
        local_144 = U_ZERO_ERROR;
        converterName = uenum_next_63(en,(int32_t *)0x0,&local_144);
        UVar1 = ucnv_canCreateConverter_63(converterName,&local_144);
        if (UVar1 != '\0') {
          uVar3 = (ulong)gAvailableConverterCount;
          gAvailableConverterCount = gAvailableConverterCount + 1;
          gAvailableConverters[uVar3] = converterName;
        }
      }
      uenum_close_63(en);
    }
  }
  return;
}

Assistant:

static void U_CALLCONV initAvailableConvertersList(UErrorCode &errCode) {
    U_ASSERT(gAvailableConverterCount == 0);
    U_ASSERT(gAvailableConverters == NULL);

    ucnv_enableCleanup();
    UEnumeration *allConvEnum = ucnv_openAllNames(&errCode);
    int32_t allConverterCount = uenum_count(allConvEnum, &errCode);
    if (U_FAILURE(errCode)) {
        return;
    }

    /* We can't have more than "*converterTable" converters to open */
    gAvailableConverters = (const char **) uprv_malloc(allConverterCount * sizeof(char*));
    if (!gAvailableConverters) {
        errCode = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    /* Open the default converter to make sure that it has first dibs in the hash table. */
    UErrorCode localStatus = U_ZERO_ERROR;
    UConverter tempConverter;
    ucnv_close(ucnv_createConverter(&tempConverter, NULL, &localStatus));

    gAvailableConverterCount = 0;

    for (int32_t idx = 0; idx < allConverterCount; idx++) {
        localStatus = U_ZERO_ERROR;
        const char *converterName = uenum_next(allConvEnum, NULL, &localStatus);
        if (ucnv_canCreateConverter(converterName, &localStatus)) {
            gAvailableConverters[gAvailableConverterCount++] = converterName;
        }
    }

    uenum_close(allConvEnum);
}